

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_internal.h
# Opt level: O2

void __thiscall FdbGcFunc::~FdbGcFunc(FdbGcFunc *this)

{
  gcNow(this);
  std::_Function_base::~_Function_base(&(this->func).super__Function_base);
  return;
}

Assistant:

~FdbGcFunc() { gcNow(); }